

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmStateSnapshot *rootSnp,cmStateSnapshot *snp_)

{
  bool bVar1;
  cmStateSnapshot snp;
  allocator local_99;
  cmStateSnapshot local_98;
  cmStateDirectory local_78;
  string local_50;
  
  local_98.Position.Position = (snp_->Position).Position;
  local_98.State = snp_->State;
  local_98.Position.Tree = (snp_->Position).Tree;
  while ((bVar1 = cmStateSnapshot::IsValid(&local_98), bVar1 &&
         (bVar1 = ::operator==(&local_98,rootSnp), !bVar1))) {
    cmStateSnapshot::GetDirectory(&local_78,&local_98);
    std::__cxx11::string::string((string *)&local_50,"EXCLUDE_FROM_ALL",&local_99);
    bVar1 = cmStateDirectory::GetPropertyAsBool(&local_78,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      return true;
    }
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&local_78,&local_98);
    local_98.Position.Position = (PositionType)local_78.Snapshot_.State;
    local_98.State = (cmState *)local_78.DirectoryState.Tree;
    local_98.Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_78.DirectoryState.Position;
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmStateSnapshot const& rootSnp,
                                   cmStateSnapshot const& snp_) const
{
  cmStateSnapshot snp = snp_;
  while (snp.IsValid()) {
    if (snp == rootSnp) {
      // No directory excludes itself.
      return false;
    }

    if (snp.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
      // This directory is excluded from its parent.
      return true;
    }
    snp = snp.GetBuildsystemDirectoryParent();
  }
  return false;
}